

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int CmpClassNoModule(void *p,void *va,void *vb)

{
  int iVar1;
  nodeclass **b;
  
  iVar1 = 1;
  if (*(uint *)(*va + 0x50) <= *(uint *)(*vb + 0x50)) {
    iVar1 = -(uint)(*(uint *)(*va + 0x50) < *(uint *)(*vb + 0x50));
  }
  return iVar1;
}

Assistant:

static NOINLINE int CmpClassNoModule(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    fourcc_t AClass = NodeClass_ClassId(*a);
    fourcc_t BClass = NodeClass_ClassId(*b);
    if (AClass > BClass) return 1;
    if (AClass < BClass) return -1;
    return 0;
}